

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O3

PyObject * libxml_next(PyObject *self,PyObject *args)

{
  int iVar1;
  undefined8 *puVar2;
  PyObject *pPVar3;
  xmlNodePtr node;
  PyObject *obj;
  undefined *local_10;
  
  iVar1 = _PyArg_ParseTuple_SizeT(args,"O:next",&local_10);
  if (iVar1 == 0) {
    return (PyObject *)0x0;
  }
  if (local_10 == &_Py_NoneStruct) {
    puVar2 = (undefined8 *)0x0;
  }
  else {
    puVar2 = *(undefined8 **)(local_10 + 0x10);
  }
  iVar1 = *(int *)(puVar2 + 1);
  node = (xmlNodePtr)0x0;
  if (iVar1 < 0xd) {
    if ((iVar1 != 2) && (iVar1 == 9)) goto LAB_0013d50a;
LAB_0013d503:
    puVar2 = puVar2 + 6;
  }
  else {
    if (iVar1 == 0xd) goto LAB_0013d50a;
    if (iVar1 != 0x12) goto LAB_0013d503;
  }
  node = (xmlNodePtr)*puVar2;
LAB_0013d50a:
  pPVar3 = libxml_xmlNodePtrWrap(node);
  return pPVar3;
}

Assistant:

static PyObject *
libxml_next(ATTRIBUTE_UNUSED PyObject * self, PyObject * args)
{
    PyObject *resultobj, *obj;
    xmlNodePtr cur;
    xmlNodePtr res;

    if (!PyArg_ParseTuple(args, (char *) "O:next", &obj))
        return NULL;
    cur = PyxmlNode_Get(obj);

    switch (cur->type) {
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
            res = NULL;
            break;
        case XML_ATTRIBUTE_NODE:{
                xmlAttrPtr attr = (xmlAttrPtr) cur;

                res = (xmlNodePtr) attr->next;
                break;
            }
        case XML_NAMESPACE_DECL:{
                xmlNsPtr ns = (xmlNsPtr) cur;

                res = (xmlNodePtr) ns->next;
                break;
            }
        default:
            res = cur->next;
            break;

    }
    resultobj = libxml_xmlNodePtrWrap(res);
    return resultobj;
}